

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddCof.c
# Opt level: O3

int cuddCheckCube(DdManager *dd,DdNode *g)

{
  DdNode *pDVar1;
  ulong uVar2;
  DdNode *one;
  DdNode *pDVar3;
  int *piVar4;
  bool bVar5;
  
  pDVar1 = dd->one;
  if (pDVar1 != g) {
    do {
      piVar4 = (int *)((ulong)g & 0xfffffffffffffffe);
      if (*piVar4 == 0x7fffffff) {
        return 0;
      }
      uVar2 = (ulong)g & 1;
      pDVar3 = (DdNode *)((ulong)*(DdNode **)(piVar4 + 6) ^ 1);
      g = (DdNode *)((ulong)*(DdNode **)(piVar4 + 4) ^ 1);
      if (uVar2 == 0) {
        pDVar3 = *(DdNode **)(piVar4 + 6);
        g = *(DdNode **)(piVar4 + 4);
      }
      if ((pDVar3 != (DdNode *)((ulong)pDVar1 ^ 1)) &&
         (bVar5 = g != (DdNode *)((ulong)pDVar1 ^ 1), g = pDVar3, bVar5)) {
        return 0;
      }
    } while (pDVar1 != g);
  }
  return 1;
}

Assistant:

int
cuddCheckCube(
  DdManager * dd,
  DdNode * g)
{
    DdNode *g1,*g0,*one,*zero;
    
    one = DD_ONE(dd);
    if (g == one) return(1);
    if (Cudd_IsConstant(g)) return(0);

    zero = Cudd_Not(one);
    cuddGetBranches(g,&g1,&g0);

    if (g0 == zero) {
        return(cuddCheckCube(dd, g1));
    }
    if (g1 == zero) {
        return(cuddCheckCube(dd, g0));
    }
    return(0);

}